

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int * Cudd_SupportIndex(DdManager *dd,DdNode *f)

{
  int local_34;
  int local_2c;
  int size;
  int i;
  int *support;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_34 = dd->sizeZ;
  }
  else {
    local_34 = dd->size;
  }
  dd_local = (DdManager *)malloc((long)local_34 << 2);
  if (dd_local == (DdManager *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
      (&(dd_local->sentinel).index)[local_2c] = 0;
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),(int *)dd_local);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  }
  return (int *)dd_local;
}

Assistant:

int *
Cudd_SupportIndex(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support is sought */)
{
    int *support;
    int i;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    return(support);

}